

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

void icu_63::number::impl::blueprint_helpers::parseMeasureUnitOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  undefined4 uVar1;
  char *__s1;
  char16_t cVar2;
  UErrorCode UVar3;
  uint uVar4;
  ulong uVar5;
  char *__s2;
  undefined4 uVar6;
  int offset;
  int iVar7;
  long lVar8;
  ulong uVar9;
  MeasureUnit *dest;
  UErrorCode localStatus;
  ConstChar16Ptr local_3f8;
  ConstChar16Ptr local_3f0;
  char16_t *local_3e8;
  char16_t *local_3d8;
  UnicodeString stemString;
  CharString subType;
  CharString type;
  MeasureUnit units [30];
  
  numparse::impl::StringSegment::toTempUnicodeString(&stemString,segment);
  iVar7 = 1;
  lVar8 = -2;
  while( true ) {
    offset = iVar7 + -1;
    uVar6 = (int)stemString.fUnion.fStackFields.fLengthAndFlags >> 5;
    uVar1 = uVar6;
    if (stemString.fUnion.fStackFields.fLengthAndFlags < 0) {
      uVar1 = stemString.fUnion.fFields.fLength;
    }
    if ((int)uVar1 <= offset) goto LAB_002625cf;
    cVar2 = UnicodeString::doCharAt(&stemString,offset);
    if (cVar2 == L'-') break;
    iVar7 = iVar7 + 1;
    lVar8 = lVar8 + -2;
  }
  uVar6 = (int)stemString.fUnion.fStackFields.fLengthAndFlags >> 5;
LAB_002625cf:
  if (stemString.fUnion.fStackFields.fLengthAndFlags < 0) {
    uVar6 = stemString.fUnion.fFields.fLength;
  }
  if (iVar7 - uVar6 == 1) {
    *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
  }
  else {
    MaybeStackArray<char,_40>::MaybeStackArray(&type.buffer);
    type.len = 0;
    *type.buffer.ptr = '\0';
    subType.buffer.ptr._0_4_ = U_ZERO_ERROR;
    if ((stemString.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
      local_3f0.p_ = stemString.fUnion.fFields.fArray;
      if ((stemString.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        local_3f0.p_ = (char16_t *)((long)&stemString.fUnion + 2);
      }
    }
    else {
      local_3f0.p_ = (char16_t *)0x0;
    }
    UnicodeString::UnicodeString((UnicodeString *)units,'\0',&local_3f0,offset);
    CharString::appendInvariantChars(&type,(UnicodeString *)units,(UErrorCode *)&subType);
    UnicodeString::~UnicodeString((UnicodeString *)units);
    local_3d8 = local_3f0.p_;
    UVar3 = U_NUMBER_SKELETON_SYNTAX_ERROR;
    if (((UErrorCode)subType.buffer.ptr == U_INVARIANT_CONVERSION_ERROR) ||
       (UVar3 = (UErrorCode)subType.buffer.ptr, U_ZERO_ERROR < (UErrorCode)subType.buffer.ptr)) {
      *status = UVar3;
    }
    else {
      MaybeStackArray<char,_40>::MaybeStackArray(&subType.buffer);
      subType.len = 0;
      *(undefined1 *)CONCAT44(subType.buffer.ptr._4_4_,(UErrorCode)subType.buffer.ptr) = 0;
      localStatus = U_ZERO_ERROR;
      if ((stemString.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
        if ((stemString.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          stemString.fUnion.fFields.fArray = (char16_t *)((long)&stemString.fUnion + 2);
        }
      }
      else {
        stemString.fUnion.fFields.fArray = (char16_t *)0x0;
      }
      local_3f8.p_ = (char16_t *)((long)stemString.fUnion.fFields.fArray - lVar8);
      if (-1 < stemString.fUnion.fStackFields.fLengthAndFlags) {
        stemString.fUnion.fFields.fLength = (int)stemString.fUnion.fStackFields.fLengthAndFlags >> 5
        ;
      }
      UnicodeString::UnicodeString
                ((UnicodeString *)units,'\0',&local_3f8,stemString.fUnion.fFields.fLength - iVar7);
      CharString::appendInvariantChars(&subType,(UnicodeString *)units,&localStatus);
      UnicodeString::~UnicodeString((UnicodeString *)units);
      local_3e8 = local_3f8.p_;
      UVar3 = U_NUMBER_SKELETON_SYNTAX_ERROR;
      if ((localStatus == U_INVARIANT_CONVERSION_ERROR) ||
         (UVar3 = localStatus, U_ZERO_ERROR < localStatus)) {
        *status = UVar3;
      }
      else {
        lVar8 = 0;
        do {
          MeasureUnit::MeasureUnit((MeasureUnit *)(units[0].fCurrency + lVar8 + -0x10));
          lVar8 = lVar8 + 0x18;
        } while (lVar8 != 0x2d0);
        localStatus = U_ZERO_ERROR;
        dest = units;
        uVar4 = MeasureUnit::getAvailable(type.buffer.ptr,dest,0x1e,&localStatus);
        if (localStatus < U_ILLEGAL_ARGUMENT_ERROR) {
          uVar9 = 0;
          uVar5 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar5 = uVar9;
          }
          do {
            uVar9 = uVar9 - 0x18;
            if (uVar5 * 0x18 + 0x18 + uVar9 == 0) {
              UVar3 = U_NUMBER_SKELETON_SYNTAX_ERROR;
              goto LAB_0026283a;
            }
            __s1 = (char *)CONCAT44(subType.buffer.ptr._4_4_,(UErrorCode)subType.buffer.ptr);
            __s2 = MeasureUnit::getSubtype(dest);
            dest = dest + 1;
            iVar7 = strcmp(__s1,__s2);
          } while (iVar7 != 0);
          MeasureUnit::operator=(&macros->unit,(MeasureUnit *)((long)&type + (0x28 - uVar9)));
        }
        else {
          UVar3 = U_INTERNAL_PROGRAM_ERROR;
LAB_0026283a:
          *status = UVar3;
        }
        lVar8 = 0x2b8;
        do {
          MeasureUnit::~MeasureUnit((MeasureUnit *)(units[0].fCurrency + lVar8 + -0x10));
          lVar8 = lVar8 + -0x18;
        } while (lVar8 != -0x18);
      }
      MaybeStackArray<char,_40>::~MaybeStackArray(&subType.buffer);
    }
    MaybeStackArray<char,_40>::~MaybeStackArray(&type.buffer);
  }
  UnicodeString::~UnicodeString(&stemString);
  return;
}

Assistant:

void blueprint_helpers::parseMeasureUnitOption(const StringSegment& segment, MacroProps& macros,
                                               UErrorCode& status) {
    const UnicodeString stemString = segment.toTempUnicodeString();

    // NOTE: The category (type) of the unit is guaranteed to be a valid subtag (alphanumeric)
    // http://unicode.org/reports/tr35/#Validity_Data
    int firstHyphen = 0;
    while (firstHyphen < stemString.length() && stemString.charAt(firstHyphen) != '-') {
        firstHyphen++;
    }
    if (firstHyphen == stemString.length()) {
        // throw new SkeletonSyntaxException("Invalid measure unit option", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }

    // Need to do char <-> UChar conversion...
    U_ASSERT(U_SUCCESS(status));
    CharString type;
    SKELETON_UCHAR_TO_CHAR(type, stemString, 0, firstHyphen, status);
    CharString subType;
    SKELETON_UCHAR_TO_CHAR(subType, stemString, firstHyphen + 1, stemString.length(), status);

    // Note: the largest type as of this writing (March 2018) is "volume", which has 24 units.
    static constexpr int32_t CAPACITY = 30;
    MeasureUnit units[CAPACITY];
    UErrorCode localStatus = U_ZERO_ERROR;
    int32_t numUnits = MeasureUnit::getAvailable(type.data(), units, CAPACITY, localStatus);
    if (U_FAILURE(localStatus)) {
        // More than 30 units in this type?
        status = U_INTERNAL_PROGRAM_ERROR;
        return;
    }
    for (int32_t i = 0; i < numUnits; i++) {
        auto& unit = units[i];
        if (uprv_strcmp(subType.data(), unit.getSubtype()) == 0) {
            macros.unit = unit;
            return;
        }
    }

    // throw new SkeletonSyntaxException("Unknown measure unit", segment);
    status = U_NUMBER_SKELETON_SYNTAX_ERROR;
}